

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O2

int testMultiFunctionDefaultFunctionName(void)

{
  ulong uVar1;
  bool bVar2;
  ResultType RVar3;
  ModelDescription *interface;
  ostream *poVar4;
  FunctionDescription *pFVar5;
  undefined8 *puVar6;
  int iVar7;
  char *pcVar8;
  ValidationPolicy local_7c;
  undefined1 local_78 [40];
  Model m;
  
  CoreML::Specification::Model::Model(&m);
  local_7c.allowsEmptyInput = true;
  local_7c.allowsEmptyOutput = true;
  local_7c.allowsMultipleFunctions = true;
  local_7c.allowsStatefulPrediction = false;
  interface = CoreML::Specification::Model::_internal_mutable_description(&m);
  uVar1 = (interface->super_MessageLite)._internal_metadata_.ptr_;
  puVar6 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar6 = (undefined8 *)*puVar6;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&interface->defaultfunctionname_,"foo",puVar6);
  CoreML::validateModelDescription((Result *)local_78,interface,9,&local_7c);
  bVar2 = CoreML::Result::good((Result *)local_78);
  std::__cxx11::string::~string((string *)(local_78 + 8));
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x130);
    poVar4 = std::operator<<(poVar4,": error: ");
    pcVar8 = 
    "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
    ;
LAB_0013836d:
    poVar4 = std::operator<<(poVar4,pcVar8);
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    CoreML::validateModelDescription((Result *)local_78,interface,9,&local_7c);
    RVar3 = CoreML::Result::type((Result *)local_78);
    std::__cxx11::string::~string((string *)(local_78 + 8));
    if (RVar3 != INVALID_DEFAULT_FUNCTION_NAME) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x130);
      poVar4 = std::operator<<(poVar4,": error: ");
      pcVar8 = 
      "((ResultType::INVALID_DEFAULT_FUNCTION_NAME)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
      ;
      goto LAB_0013836d;
    }
    pFVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::FunctionDescription>::Add
                       (&interface->functions_);
    uVar1 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    puVar6 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar6 = (undefined8 *)*puVar6;
    }
    google::protobuf::internal::ArenaStringPtr::
    Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar5->name_,"bar",puVar6);
    CoreML::validateModelDescription((Result *)local_78,interface,9,&local_7c);
    bVar2 = CoreML::Result::good((Result *)local_78);
    std::__cxx11::string::~string((string *)(local_78 + 8));
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x134);
      poVar4 = std::operator<<(poVar4,": error: ");
      pcVar8 = 
      "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
      ;
    }
    else {
      CoreML::validateModelDescription((Result *)local_78,interface,9,&local_7c);
      RVar3 = CoreML::Result::type((Result *)local_78);
      std::__cxx11::string::~string((string *)(local_78 + 8));
      if (RVar3 == INVALID_DEFAULT_FUNCTION_NAME) {
        uVar1 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
        puVar6 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          puVar6 = (undefined8 *)*puVar6;
        }
        google::protobuf::internal::ArenaStringPtr::
        Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar5->name_,"foo",puVar6);
        CoreML::validateModelDescription((Result *)local_78,interface,9,&local_7c);
        bVar2 = CoreML::Result::good((Result *)local_78);
        std::__cxx11::string::~string((string *)(local_78 + 8));
        iVar7 = 0;
        if (bVar2) goto LAB_001384cb;
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x137);
        poVar4 = std::operator<<(poVar4,": error: ");
        pcVar8 = 
        "(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).good()"
        ;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x134);
        poVar4 = std::operator<<(poVar4,": error: ");
        pcVar8 = 
        "((ResultType::INVALID_DEFAULT_FUNCTION_NAME)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
        ;
      }
    }
    poVar4 = std::operator<<(poVar4,pcVar8);
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  iVar7 = 1;
LAB_001384cb:
  CoreML::Specification::Model::~Model(&m);
  return iVar7;
}

Assistant:

int testMultiFunctionDefaultFunctionName() {
    Specification::Model m;

    auto validationPolicy = ValidationPolicy();
    validationPolicy.allowsEmptyInput = true;
    validationPolicy.allowsEmptyOutput = true;
    validationPolicy.allowsMultipleFunctions = true;

    auto *description = m.mutable_description();
    description->set_defaultfunctionname("foo");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_DEFAULT_FUNCTION_NAME);

    auto *function = description->add_functions();
    function->set_name("bar");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_DEFAULT_FUNCTION_NAME);

    function->set_name("foo");
    ML_ASSERT_GOOD(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy));

    return 0;
}